

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::
     ctor<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,capnp::Orphan<capnp::compiler::Expression>,capnp::Orphan<capnp::compiler::Expression>,kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>>,kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,capnp::Orphan<capnp::compiler::Expression>,capnp::Orphan<capnp::compiler::Expression>,kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>>>
               (Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
                *location,
               Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
               *params)

{
  Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  *this;
  Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  *pTVar1;
  Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  *params_local;
  Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  *location_local;
  
  this = (Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
          *)operator_new(0x98);
  if (this != (Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
               *)0x0) {
    pTVar1 = fwd<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,capnp::Orphan<capnp::compiler::Expression>,capnp::Orphan<capnp::compiler::Expression>,kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>>>
                       (params);
    _::
    Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
    ::Tuple(this,pTVar1);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}